

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

uint64_t __thiscall clunk::Node::QPerftSearch<false>(Node *this,int depth)

{
  int iVar1;
  long *plVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  if (depth < 1) {
    GenerateMoves<false,true>(this,depth);
    plVar2 = (long *)(_stats + 0x38);
  }
  else {
    GenerateMoves<false,false>(this,depth);
    plVar2 = (long *)(_stats + 0x30);
  }
  *plVar2 = *plVar2 + (long)this->moveCount;
  if (depth < 0 || ((long)this->moveCount == 0 || this->child == (Node *)0x0)) {
    uVar4 = (long)this->moveCount + 1;
  }
  else {
    uVar4 = 1;
    if (_stop == 0) {
      do {
        iVar1 = this->moveIndex;
        if (this->moveCount <= iVar1) {
          return uVar4;
        }
        this->moveIndex = iVar1 + 1;
        Exec<false>(this,this->moves + iVar1,this->child);
        uVar3 = QPerftSearch<true>(this->child,depth + -1);
        uVar4 = uVar4 + uVar3;
        Undo<false>(this,this->moves + iVar1);
      } while (_stop == 0);
    }
  }
  return uVar4;
}

Assistant:

uint64_t QPerftSearch(const int depth) {
    if (depth <= 0) {
      GenerateMoves<color, true>(depth);
      _stats.qnodes += moveCount;
    }
    else {
      GenerateMoves<color, false>(depth);
      _stats.snodes += moveCount;
    }
    if ((!child) | (!moveCount) | (depth < 0)) {
      return (moveCount + 1);
    }

    uint64_t count = 1;
    while (!_stop && (moveIndex < moveCount)) {
      const Move& move = moves[moveIndex++];
      Exec<color>(move, *child);
      count += child->QPerftSearch<!color>(depth - 1);
      Undo<color>(move);
    }
    return count;
  }